

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

size_t psql::get_size_struct<1ul,psql::query_message>
                 (query_message *input,serialization_context *ctx)

{
  undefined1 local_20 [8];
  tuple<psql::string_null_psql::query_message::*> fields;
  serialization_context *ctx_local;
  query_message *input_local;
  
  fields.super__Tuple_impl<0UL,_psql::string_null_psql::query_message::*>.
  super__Head_base<0UL,_psql::string_null_psql::query_message::*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_psql::string_null_psql::query_message::*>)
       (_Tuple_impl<0UL,_psql::string_null_psql::query_message::*>)ctx;
  memset(local_20,0,8);
  return 0;
}

Assistant:

std::size_t get_size_struct(
	[[maybe_unused]] const T& input,
	[[maybe_unused]] const serialization_context& ctx
) noexcept
{
	constexpr auto fields = get_struct_fields<T>::value;
	if constexpr (index == std::tuple_size<decltype(fields)>::value)
	{
		return 0;
	}
	else
	{
		constexpr auto pmem = std::get<index>(fields);
		return get_size_struct<index+1>(input, ctx) +
		       get_size(input.*pmem, ctx);
	}
}